

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

TidyMessageImpl *
formatEncodingReport
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  ctmbstr ptVar4;
  ctmbstr ptVar5;
  TidyMessageImpl *pTVar6;
  ulong uVar7;
  uint encoding;
  uint messageType;
  char buf [32];
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  uVar1 = args->gp_offset;
  uVar7 = (ulong)uVar1;
  if (uVar7 < 0x29) {
    args->gp_offset = (uint)(uVar7 + 8);
    encoding = *(uint *)((long)args->reg_save_area + uVar7);
    if (0x20 < uVar1) goto LAB_0014f1b7;
    piVar3 = (int *)(uVar7 + 8 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 0x10;
  }
  else {
    puVar2 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar2 + 2;
    encoding = *puVar2;
LAB_0014f1b7:
    piVar3 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar3 + 2;
  }
  messageType = 0x1f7;
  if (*piVar3 == 0) {
    messageType = 0x1fd;
  }
  ptVar4 = tidyLocalizedString(messageType);
  switch(code) {
  case 0x249:
    NtoS(encoding,buf);
    uVar1 = 0x40;
    break;
  case 0x24a:
    NtoS(encoding,buf);
    uVar1 = 2;
    break;
  case 0x24b:
    prvTidytmbsnprintf(buf,0x20,"U+%04X",(ulong)encoding);
    uVar1 = 4;
    break;
  case 0x24c:
    prvTidytmbsnprintf(buf,0x20,"U+%04X",(ulong)encoding);
    uVar1 = 8;
    break;
  default:
    if (code == 0x23b) {
      *(byte *)&doc->badChars = (byte)doc->badChars | 0x10;
      ptVar4 = prvTidyCharEncodingName(doc->docIn->encoding);
      ptVar5 = prvTidyCharEncodingName(encoding);
      pTVar6 = prvTidytidyMessageCreateWithLexer(doc,0x23b,level,ptVar4,ptVar5);
      return pTVar6;
    }
    if (code != 0x28f) goto LAB_0014f2be;
    NtoS(encoding,buf);
    uVar1 = 1;
  }
  doc->badChars = doc->badChars | uVar1;
LAB_0014f2be:
  pTVar6 = prvTidytidyMessageCreateWithLexer(doc,code,level,ptVar4,buf);
  return pTVar6;
}

Assistant:

TidyMessageImpl *formatEncodingReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char buf[ 32 ] = {'\0'};
    uint c = va_arg( args, uint );
    Bool discarded = va_arg( args, Bool );
    ctmbstr action = tidyLocalizedString(discarded ? STRING_DISCARDING : STRING_REPLACING);

    switch (code)
    {
        case INVALID_NCR:
            NtoS(c, buf);
            doc->badChars |= BC_INVALID_NCR;
            break;

        case INVALID_SGML_CHARS:
            NtoS(c, buf);
            doc->badChars |= BC_INVALID_SGML_CHARS;
            break;

        case INVALID_UTF8:
            TY_(tmbsnprintf)(buf, sizeof(buf), "U+%04X", c);
            doc->badChars |= BC_INVALID_UTF8;
            break;

        case INVALID_UTF16:
            TY_(tmbsnprintf)(buf, sizeof(buf), "U+%04X", c);
            doc->badChars |= BC_INVALID_UTF16;
            break;

        case VENDOR_SPECIFIC_CHARS:
            NtoS(c, buf);
            doc->badChars |= BC_VENDOR_SPECIFIC_CHARS;
            break;

        case ENCODING_MISMATCH:
            doc->badChars |= BC_ENCODING_MISMATCH;
            return TY_(tidyMessageCreateWithLexer)(doc,
                                                   code,
                                                   level,
                                                   TY_(CharEncodingName)(doc->docIn->encoding),
                                                   TY_(CharEncodingName)(c));
            break;
    }

    return TY_(tidyMessageCreateWithLexer)(doc, code, level, action, buf );

}